

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grob_array.h
# Opt level: O0

void __thiscall lume::GrobArray::push_back(GrobArray *this,initializer_list<unsigned_int> inds)

{
  index_t iVar1;
  size_type sVar2;
  BadNumberOfIndices *this_00;
  char *pcVar3;
  string *psVar4;
  string *what;
  uint local_bc;
  const_iterator puStack_b8;
  uint i;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<unsigned_int> *__range2;
  __cxx11 local_98 [32];
  __cxx11 local_78 [55];
  allocator local_41;
  string local_40 [32];
  GrobArray *local_20;
  GrobArray *this_local;
  initializer_list<unsigned_int> inds_local;
  
  inds_local._M_array = (iterator)inds._M_len;
  this_local = (GrobArray *)inds._M_array;
  local_20 = this;
  sVar2 = std::initializer_list<unsigned_int>::size((initializer_list<unsigned_int> *)&this_local);
  iVar1 = num_grob_corners(this);
  if (sVar2 != iVar1) {
    __range2._7_1_ = 1;
    this_00 = (BadNumberOfIndices *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"expected: ",&local_41);
    iVar1 = num_grob_corners(this);
    std::__cxx11::to_string(local_78,iVar1);
    pcVar3 = (char *)std::__cxx11::string::append(local_40);
    psVar4 = (string *)std::__cxx11::string::append(pcVar3);
    sVar2 = std::initializer_list<unsigned_int>::size((initializer_list<unsigned_int> *)&this_local)
    ;
    std::__cxx11::to_string(local_98,sVar2);
    what = (string *)std::__cxx11::string::append(psVar4);
    BadNumberOfIndices::BadNumberOfIndices(this_00,what);
    __range2._7_1_ = 0;
    __cxa_throw(this_00,&BadNumberOfIndices::typeinfo,BadNumberOfIndices::~BadNumberOfIndices);
  }
  __begin2 = (const_iterator)&this_local;
  __end2 = std::initializer_list<unsigned_int>::begin((initializer_list<unsigned_int> *)__begin2);
  puStack_b8 = std::initializer_list<unsigned_int>::end((initializer_list<unsigned_int> *)__begin2);
  for (; __end2 != puStack_b8; __end2 = __end2 + 1) {
    local_bc = *__end2;
    ArrayAnnex<unsigned_int>::push_back(&this->m_array,&local_bc);
  }
  return;
}

Assistant:

inline void push_back (std::initializer_list <index_t> inds)
	{
		using std::string;
		using std::to_string;

		if (inds.size() != num_grob_corners())
			throw BadNumberOfIndices (string ("expected: ").
			                          append (to_string (num_grob_corners())).
			                          append (", given: ").
			                          append (to_string (inds.size())));

		for(auto i : inds) 
			m_array.push_back (i);
	}